

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall CS248::Matrix4x4::inv(Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double *pdVar16;
  Matrix4x4 *in_RDI;
  double x;
  double dVar17;
  double dVar18;
  double dVar19;
  Matrix4x4 *A;
  Matrix4x4 *B;
  int in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff6cc;
  Matrix4x4 *in_stack_fffffffffffff6d0;
  Matrix4x4 *this_00;
  Matrix4x4 *in_stack_fffffffffffff6e0;
  Matrix4x4 *this_01;
  Matrix4x4 *this_02;
  
  Matrix4x4(in_stack_fffffffffffff6e0);
  pdVar16 = operator()(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8
                      );
  this_00 = (Matrix4x4 *)*pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  x = (double)this_00 * *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  this_01 = (Matrix4x4 *)*pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = dVar17 * *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  dVar18 = x * (double)this_01;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar11 * dVar12 * dVar13 +
             -(dVar8 * dVar9) * dVar10 +
             -(dVar5 * dVar6) * dVar7 + dVar2 * dVar3 * dVar4 + dVar18 + -(dVar17 * dVar1);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar19 * dVar14 * dVar15 +
             -(dVar12 * dVar13) * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  this_02 = (Matrix4x4 *)*pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  dVar19 = dVar17 * dVar1 * (double)this_02;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar12 * dVar13 * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar5 + dVar19 + -(dVar2 * dVar3 * dVar4);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar19 * dVar14 * dVar15 +
             -(dVar12 * dVar13) * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar19 * dVar14 * dVar15 +
             -(dVar12 * dVar13) * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar19 * dVar14 * dVar15 +
             -(dVar12 * dVar13) * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar19 * dVar14 * dVar15 +
             -(dVar12 * dVar13) * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = -(dVar19 * dVar14) * dVar15 +
             dVar12 * dVar13 * dVar18 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar17 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar1 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar2 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar3 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar4 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar5 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar6 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar7 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar8 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar9 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar10 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar11 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar12 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar13 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar18 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar19 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar14 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  dVar15 = *pdVar16;
  pdVar16 = operator()(this_00,in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8);
  *pdVar16 = dVar19 * dVar14 * dVar15 +
             -(dVar12 * dVar13) * dVar18 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar17 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  det(this_02);
  operator/=(this_01,x);
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::inv( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

	// Hardcoded in Fully Symbolic computation.

	B(0,0) = A(1,2)*A(2,3)*A(3,1) - A(1,3)*A(2,2)*A(3,1) + A(1,3)*A(2,1)*A(3,2) - A(1,1)*A(2,3)*A(3,2) - A(1,2)*A(2,1)*A(3,3) + A(1,1)*A(2,2)*A(3,3);
	B(0,1) = A(0,3)*A(2,2)*A(3,1) - A(0,2)*A(2,3)*A(3,1) - A(0,3)*A(2,1)*A(3,2) + A(0,1)*A(2,3)*A(3,2) + A(0,2)*A(2,1)*A(3,3) - A(0,1)*A(2,2)*A(3,3);
	B(0,2) = A(0,2)*A(1,3)*A(3,1) - A(0,3)*A(1,2)*A(3,1) + A(0,3)*A(1,1)*A(3,2) - A(0,1)*A(1,3)*A(3,2) - A(0,2)*A(1,1)*A(3,3) + A(0,1)*A(1,2)*A(3,3);
	B(0,3) = A(0,3)*A(1,2)*A(2,1) - A(0,2)*A(1,3)*A(2,1) - A(0,3)*A(1,1)*A(2,2) + A(0,1)*A(1,3)*A(2,2) + A(0,2)*A(1,1)*A(2,3) - A(0,1)*A(1,2)*A(2,3);
	B(1,0) = A(1,3)*A(2,2)*A(3,0) - A(1,2)*A(2,3)*A(3,0) - A(1,3)*A(2,0)*A(3,2) + A(1,0)*A(2,3)*A(3,2) + A(1,2)*A(2,0)*A(3,3) - A(1,0)*A(2,2)*A(3,3);
	B(1,1) = A(0,2)*A(2,3)*A(3,0) - A(0,3)*A(2,2)*A(3,0) + A(0,3)*A(2,0)*A(3,2) - A(0,0)*A(2,3)*A(3,2) - A(0,2)*A(2,0)*A(3,3) + A(0,0)*A(2,2)*A(3,3);
	B(1,2) = A(0,3)*A(1,2)*A(3,0) - A(0,2)*A(1,3)*A(3,0) - A(0,3)*A(1,0)*A(3,2) + A(0,0)*A(1,3)*A(3,2) + A(0,2)*A(1,0)*A(3,3) - A(0,0)*A(1,2)*A(3,3);
	B(1,3) = A(0,2)*A(1,3)*A(2,0) - A(0,3)*A(1,2)*A(2,0) + A(0,3)*A(1,0)*A(2,2) - A(0,0)*A(1,3)*A(2,2) - A(0,2)*A(1,0)*A(2,3) + A(0,0)*A(1,2)*A(2,3);
	B(2,0) = A(1,1)*A(2,3)*A(3,0) - A(1,3)*A(2,1)*A(3,0) + A(1,3)*A(2,0)*A(3,1) - A(1,0)*A(2,3)*A(3,1) - A(1,1)*A(2,0)*A(3,3) + A(1,0)*A(2,1)*A(3,3);
	B(2,1) = A(0,3)*A(2,1)*A(3,0) - A(0,1)*A(2,3)*A(3,0) - A(0,3)*A(2,0)*A(3,1) + A(0,0)*A(2,3)*A(3,1) + A(0,1)*A(2,0)*A(3,3) - A(0,0)*A(2,1)*A(3,3);
	B(2,2) = A(0,1)*A(1,3)*A(3,0) - A(0,3)*A(1,1)*A(3,0) + A(0,3)*A(1,0)*A(3,1) - A(0,0)*A(1,3)*A(3,1) - A(0,1)*A(1,0)*A(3,3) + A(0,0)*A(1,1)*A(3,3);
	B(2,3) = A(0,3)*A(1,1)*A(2,0) - A(0,1)*A(1,3)*A(2,0) - A(0,3)*A(1,0)*A(2,1) + A(0,0)*A(1,3)*A(2,1) + A(0,1)*A(1,0)*A(2,3) - A(0,0)*A(1,1)*A(2,3);
	B(3,0) = A(1,2)*A(2,1)*A(3,0) - A(1,1)*A(2,2)*A(3,0) - A(1,2)*A(2,0)*A(3,1) + A(1,0)*A(2,2)*A(3,1) + A(1,1)*A(2,0)*A(3,2) - A(1,0)*A(2,1)*A(3,2);
	B(3,1) = A(0,1)*A(2,2)*A(3,0) - A(0,2)*A(2,1)*A(3,0) + A(0,2)*A(2,0)*A(3,1) - A(0,0)*A(2,2)*A(3,1) - A(0,1)*A(2,0)*A(3,2) + A(0,0)*A(2,1)*A(3,2);
	B(3,2) = A(0,2)*A(1,1)*A(3,0) - A(0,1)*A(1,2)*A(3,0) - A(0,2)*A(1,0)*A(3,1) + A(0,0)*A(1,2)*A(3,1) + A(0,1)*A(1,0)*A(3,2) - A(0,0)*A(1,1)*A(3,2);
	B(3,3) = A(0,1)*A(1,2)*A(2,0) - A(0,2)*A(1,1)*A(2,0) + A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) - A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2);

	// Invertable iff the determinant is not equal to zero.
    B /= det();

    return B;
  }